

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

SessionID * __thiscall
FIX::Message::getSessionID(SessionID *__return_storage_ptr__,Message *this,string *qualifier)

{
  Header *this_00;
  FieldBase *pFVar1;
  FieldBase *pFVar2;
  FieldBase *pFVar3;
  
  this_00 = &this->m_header;
  pFVar1 = FieldMap::getFieldRef(&this_00->super_FieldMap,8);
  pFVar2 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x31);
  pFVar3 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x38);
  SessionID::SessionID
            (__return_storage_ptr__,&pFVar1->m_string,&pFVar2->m_string,&pFVar3->m_string,qualifier)
  ;
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldNotFound) {
  return SessionID(
      getHeader().getField<BeginString>(),
      getHeader().getField<SenderCompID>(),
      getHeader().getField<TargetCompID>(),
      qualifier);
}